

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdopt_utils.h
# Opt level: O0

THR_MODES get_prediction_mode_idx
                    (PREDICTION_MODE this_mode,MV_REFERENCE_FRAME ref_frame,
                    MV_REFERENCE_FRAME second_ref_frame)

{
  MV_REFERENCE_FRAME second_ref_frame_local;
  MV_REFERENCE_FRAME ref_frame_local;
  PREDICTION_MODE this_mode_local;
  THR_MODES local_1;
  
  if (this_mode < 0xd) {
    local_1 = intra_to_mode_idx[(int)(uint)this_mode];
  }
  else if ((this_mode < 0xd) || (0x10 < this_mode)) {
    if ((this_mode < 0x11) || ((0x18 < this_mode || (second_ref_frame == -1)))) {
      local_1 = 0xff;
    }
    else {
      local_1 = comp_inter_to_mode_idx[(int)(this_mode - 0x11)][ref_frame][second_ref_frame];
    }
  }
  else {
    local_1 = single_inter_to_mode_idx[(int)(this_mode - 0xd)][ref_frame];
  }
  return local_1;
}

Assistant:

static inline THR_MODES get_prediction_mode_idx(
    PREDICTION_MODE this_mode, MV_REFERENCE_FRAME ref_frame,
    MV_REFERENCE_FRAME second_ref_frame) {
  if (this_mode < INTRA_MODE_END) {
    assert(ref_frame == INTRA_FRAME);
    assert(second_ref_frame == NONE_FRAME);
    return intra_to_mode_idx[this_mode - INTRA_MODE_START];
  }
  if (this_mode >= SINGLE_INTER_MODE_START &&
      this_mode < SINGLE_INTER_MODE_END) {
    assert((ref_frame > INTRA_FRAME) && (ref_frame <= ALTREF_FRAME));
    return single_inter_to_mode_idx[this_mode - SINGLE_INTER_MODE_START]
                                   [ref_frame];
  }
  if (this_mode >= COMP_INTER_MODE_START && this_mode < COMP_INTER_MODE_END &&
      second_ref_frame != NONE_FRAME) {
    assert((ref_frame > INTRA_FRAME) && (ref_frame <= ALTREF_FRAME));
    assert((second_ref_frame > INTRA_FRAME) &&
           (second_ref_frame <= ALTREF_FRAME));
    return comp_inter_to_mode_idx[this_mode - COMP_INTER_MODE_START][ref_frame]
                                 [second_ref_frame];
  }
  assert(0);
  return THR_INVALID;
}